

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiTable *pIVar1;
  long lVar2;
  int i;
  ulong uVar3;
  long lVar4;
  ImGuiContext *g;
  
  lVar2 = 8;
  for (uVar3 = 0; uVar3 != (uint)(ctx->Tables).Map.Data.Size; uVar3 = uVar3 + 1) {
    pIVar1 = (ctx->Tables).Buf.Data;
    lVar4 = (long)*(int *)((long)&((ctx->Tables).Map.Data.Data)->key + lVar2);
    if (pIVar1 != (ImGuiTable *)0x0 && lVar4 != -1) {
      pIVar1[lVar4].SettingsOffset = -1;
    }
    lVar2 = lVar2 + 0x10;
  }
  ImVector<char>::clear(&(ctx->SettingsTables).Buf);
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
            table->SettingsOffset = -1;
    g.SettingsTables.clear();
}